

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O3

void __thiscall duckdb::Planner::CreatePlan(Planner *this,SQLStatement *statement)

{
  shared_ptr<duckdb::BoundParameterData,_true> *this_00;
  size_type sVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  idx_t iVar3;
  element_type *peVar4;
  bool bVar5;
  StatementReturnType SVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  bool bVar9;
  QueryProfiler *this_01;
  Binder *pBVar10;
  ClientConfig *pCVar11;
  type op;
  BoundParameterData *pBVar12;
  BoundParameterData *pBVar13;
  mapped_type *this_02;
  __node_base _Var14;
  BoundStatement bound_statement;
  ErrorData error;
  BoundParameterMap bound_parameters;
  undefined1 local_150 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130 [96];
  LogicalType local_d0;
  BoundParameterMap local_b8;
  Value local_70;
  
  this_01 = QueryProfiler::Get(this->context);
  sVar1 = (statement->named_param_map)._M_h._M_element_count;
  BoundParameterMap::BoundParameterMap(&local_b8,&this->parameter_data);
  QueryProfiler::StartPhase(this_01,PLANNER_BINDING);
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->(&this->binder);
  (pBVar10->parameters).ptr = &local_b8;
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->(&this->binder);
  Binder::Bind((BoundStatement *)local_150,pBVar10,statement);
  QueryProfiler::EndPhase(this_01);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_130);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&this->types,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_150 + 8));
  uVar8 = local_150._0_8_;
  local_150._0_8_ =
       (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       0x0;
  _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (this->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (this->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar8;
  if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  pCVar11 = ClientConfig::GetConfig(this->context);
  iVar3 = pCVar11->max_expression_depth;
  op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(&this->plan);
  CheckTreeDepth(op,iVar3,0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_130);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_150 + 8));
  if ((LogicalOperator *)local_150._0_8_ != (LogicalOperator *)0x0) {
    (*(*(_func_int ***)local_150._0_8_)[1])();
  }
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->(&this->binder);
  peVar4 = (pBVar10->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  while (peVar4 != (element_type *)0x0) {
    pBVar10 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->parent);
    peVar4 = (pBVar10->parent).internal.
             super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (&pBVar10->prop != &this->properties) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->properties,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&pBVar10->prop);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->properties).modified_databases,&(pBVar10->prop).modified_databases._M_h);
  }
  bVar9 = (pBVar10->prop).allow_stream_result;
  bVar5 = (pBVar10->prop).bound_all_parameters;
  SVar6 = (pBVar10->prop).return_type;
  uVar7 = *(undefined4 *)&(pBVar10->prop).field_0x74;
  iVar3 = (pBVar10->prop).parameter_count;
  (this->properties).requires_valid_transaction = (pBVar10->prop).requires_valid_transaction;
  (this->properties).allow_stream_result = bVar9;
  (this->properties).bound_all_parameters = bVar5;
  (this->properties).return_type = SVar6;
  *(undefined4 *)&(this->properties).field_0x74 = uVar7;
  (this->properties).parameter_count = iVar3;
  (this->properties).always_require_rebind = (pBVar10->prop).always_require_rebind;
  (this->properties).parameter_count = sVar1;
  (this->properties).bound_all_parameters = (bool)((local_b8.rebind ^ 1U) & 1);
  VerifyPlan(this->context,&this->plan,
             (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>,_true>
              )&local_b8.parameters);
  if (local_b8.parameters._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var14._M_nxt = local_b8.parameters._M_h._M_before_begin._M_nxt;
    do {
      this_00 = (shared_ptr<duckdb::BoundParameterData,_true> *)(_Var14._M_nxt + 5);
      pBVar12 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      bVar9 = LogicalType::IsValid(&pBVar12->return_type);
      if (bVar9) {
        pBVar12 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        pBVar13 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        LogicalType::LogicalType(&local_d0,&pBVar13->return_type);
        Value::Value(&local_70,&local_d0);
        Value::operator=(&pBVar12->value,&local_70);
        Value::~Value(&local_70);
        LogicalType::~LogicalType(&local_d0);
        this_02 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->value_map,(key_type *)(_Var14._M_nxt + 1));
        shared_ptr<duckdb::BoundParameterData,_true>::operator=(this_02,this_00);
      }
      else {
        (this->properties).bound_all_parameters = false;
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b8.parameters._M_h);
  return;
}

Assistant:

void Planner::CreatePlan(SQLStatement &statement) {
	auto &profiler = QueryProfiler::Get(context);
	auto parameter_count = statement.named_param_map.size();

	BoundParameterMap bound_parameters(parameter_data);

	// first bind the tables and columns to the catalog
	bool parameters_resolved = true;
	try {
		profiler.StartPhase(MetricsType::PLANNER_BINDING);
		binder->parameters = &bound_parameters;
		auto bound_statement = binder->Bind(statement);
		profiler.EndPhase();

		this->names = bound_statement.names;
		this->types = bound_statement.types;
		this->plan = std::move(bound_statement.plan);

		auto max_tree_depth = ClientConfig::GetConfig(context).max_expression_depth;
		CheckTreeDepth(*plan, max_tree_depth);
	} catch (const std::exception &ex) {
		ErrorData error(ex);
		this->plan = nullptr;
		if (error.Type() == ExceptionType::PARAMETER_NOT_RESOLVED) {
			// parameter types could not be resolved
			this->names = {"unknown"};
			this->types = {LogicalTypeId::UNKNOWN};
			parameters_resolved = false;
		} else if (error.Type() != ExceptionType::INVALID) {
			// different exception type - try operator_extensions
			auto &config = DBConfig::GetConfig(context);
			for (auto &extension_op : config.operator_extensions) {
				auto bound_statement =
				    extension_op->Bind(context, *this->binder, extension_op->operator_info.get(), statement);
				if (bound_statement.plan != nullptr) {
					this->names = bound_statement.names;
					this->types = bound_statement.types;
					this->plan = std::move(bound_statement.plan);
					break;
				}
			}
			if (!this->plan) {
				throw;
			}
		} else {
			throw;
		}
	}
	this->properties = binder->GetStatementProperties();
	this->properties.parameter_count = parameter_count;
	properties.bound_all_parameters = !bound_parameters.rebind && parameters_resolved;

	Planner::VerifyPlan(context, plan, bound_parameters.GetParametersPtr());

	// set up a map of parameter number -> value entries
	for (auto &kv : bound_parameters.GetParameters()) {
		auto &identifier = kv.first;
		auto &param = kv.second;
		// check if the type of the parameter could be resolved
		if (!param->return_type.IsValid()) {
			properties.bound_all_parameters = false;
			continue;
		}
		param->SetValue(Value(param->return_type));
		value_map[identifier] = param;
	}
}